

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::InfixExpression::to_string_abi_cxx11_
          (string *__return_storage_ptr__,InfixExpression *this)

{
  bool bVar1;
  bool bVar2;
  pointer pEVar3;
  allocator<char> local_13b;
  byte local_13a;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  byte local_113;
  byte local_112;
  byte local_111;
  string local_110;
  byte local_ee;
  byte local_ed;
  byte local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  InfixExpression *local_18;
  InfixExpression *this_local;
  
  local_18 = this;
  this_local = (InfixExpression *)__return_storage_ptr__;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_left);
  local_d9 = 0;
  local_ed = 0;
  local_ee = 0;
  local_111 = 0;
  local_112 = 0;
  local_113 = 0;
  local_139 = 0;
  local_13a = 0;
  bVar1 = false;
  if ((bVar2) &&
     (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_right), bVar2)) {
    pEVar3 = std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::
             operator->(&this->m_left);
    (*(pEVar3->super_AstNode)._vptr_AstNode[3])();
    local_d9 = 1;
    std::operator+(&local_b8,"(",&local_d8);
    local_ed = 1;
    std::operator+(&local_98,&local_b8," ");
    local_ee = 1;
    ExprNode::token_literal_abi_cxx11_(&local_110,&this->super_ExprNode);
    local_111 = 1;
    std::operator+(&local_78,&local_98,&local_110);
    local_112 = 1;
    std::operator+(&local_58,&local_78," ");
    local_113 = 1;
    pEVar3 = std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::
             operator->(&this->m_right);
    (*(pEVar3->super_AstNode)._vptr_AstNode[3])(&local_138);
    local_139 = 1;
    std::operator+(&local_38,&local_58,&local_138);
    local_13a = 1;
    std::operator+(__return_storage_ptr__,&local_38,")");
  }
  else {
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_13b);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_13b);
  }
  if ((local_13a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_139 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_138);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_112 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_111 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((local_ee & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_ed & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((local_d9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InfixExpression::to_string() const
{
    return (m_left && m_right) ? "(" + m_left->to_string()
                                   + " " + token_literal() + " "
                                   + m_right->to_string() + ")"
                               : "";
}